

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzrot::ComputeNF
          (ChNodeFEAxyzrot *this,double U,double V,double W,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 in_XMM0_Qb;
  undefined8 in_XMM1_Qb;
  ChVector<double> v_1;
  ChVector<double> absT;
  ChCoordsys<double> nodecoord;
  ChVector<double> absF;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_e8;
  ChVector<double> v;
  ChVector<double> local_88;
  PointerType local_68;
  long lStack_60;
  undefined8 local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&nodecoord,F,0,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&absF,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&nodecoord,(type *)0x0);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&nodecoord,F,3,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&absT,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&nodecoord,(type *)0x0);
  nodecoord.pos.m_data[0] = 0.0;
  nodecoord.pos.m_data[1] = 0.0;
  nodecoord.pos.m_data[2] = 0.0;
  nodecoord.rot.m_data[0] = 1.0;
  nodecoord.rot.m_data[3] = 0.0;
  nodecoord.rot.m_data[1] = 0.0;
  nodecoord.rot.m_data[2] = 0.0;
  if (state_x == (ChVectorDynamic<> *)0x0) {
    ChCoordsys<double>::operator=
              (&nodecoord,(ChCoordsys<double> *)&(this->super_ChNodeFEAbase).field_0x20);
  }
  else {
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_e8,state_x,0,7);
    ChCoordsys<double>::operator=
              (&nodecoord,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_e8);
  }
  local_48 = absF.m_data[0];
  dStack_40 = absF.m_data[1];
  local_38 = absF.m_data[2];
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = U;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = V;
  auVar1 = vunpcklpd_avx(auVar1,auVar2);
  auVar3._8_8_ = nodecoord.pos.m_data[1];
  auVar3._0_8_ = nodecoord.pos.m_data[0];
  v.m_data._0_16_ = vsubpd_avx(auVar1,auVar3);
  v.m_data[2] = W - nodecoord.pos.m_data[2];
  ChVector<double>::operator%(&local_88,&v,&absF);
  v_1.m_data[0] = absT.m_data[0] + local_88.m_data[0];
  v_1.m_data[1] = absT.m_data[1] + local_88.m_data[1];
  v_1.m_data[2] = absT.m_data[2] + local_88.m_data[2];
  ChQuaternion<double>::RotateBack(&nodecoord.rot,&v_1);
  local_68 = local_e8.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
             super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
             m_data;
  lStack_60 = local_e8.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
              super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
              m_rows.m_value;
  local_58 = local_e8.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
             super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
             _16_8_;
  v_1.m_data[0] = (double)&local_48;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock(&local_e8,Qi,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_e8.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&v_1);
  v_1.m_data[0] = (double)&local_68;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock(&local_e8,Qi,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_e8.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&v_1);
  *detJ = 1.0;
  return;
}

Assistant:

void ChNodeFEAxyzrot::ComputeNF(
    const double U,              // x coordinate of application point in absolute space
    const double V,              // y coordinate of application point in absolute space
    const double W,              // z coordinate of application point in absolute space
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is 6, it is {Force,Torque} both in absolute coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    ChVector<> abs_pos(U, V, W);
    ChVector<> absF(F.segment(0, 3));
    ChVector<> absT(F.segment(3, 3));
    ChVector<> body_absF;
    ChVector<> body_locT;
    ChCoordsys<> nodecoord;
    if (state_x)
        nodecoord = state_x->segment(0, 7);  // the numerical jacobian algo might change state_x
    else
        nodecoord = this->coord;

    // compute Q components F,T, given current state of 'nodecoord'. Note T in Q is in local csys, F is an abs csys
    body_absF = absF;
    body_locT = nodecoord.rot.RotateBack(absT + ((abs_pos - nodecoord.pos) % absF));
    Qi.segment(0, 3) = body_absF.eigen();
    Qi.segment(3, 3) = body_locT.eigen();
    detJ = 1;  // not needed because not used in quadrature.
}